

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::InlinePass::AddLoopMerge
          (InlinePass *this,uint32_t merge_id,uint32_t continue_id,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *block_ptr)

{
  IRContext *c;
  Instruction *this_00;
  long lVar1;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  uint local_15c;
  uint32_t local_158;
  uint32_t local_154;
  SmallVector<unsigned_int,_2UL> local_150;
  SmallVector<unsigned_int,_2UL> local_128;
  SmallVector<unsigned_int,_2UL> local_100;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_c0 [48];
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  this_00 = (Instruction *)operator_new(0x70);
  c = (this->super_Pass).context_;
  init_list._M_len = 1;
  init_list._M_array = &local_154;
  local_154 = merge_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list);
  local_c0._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c0 + 8),&local_100);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_158;
  local_158 = continue_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_128,init_list_00);
  local_90 = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_128);
  local_15c = 0;
  init_list_01._M_len = 1;
  init_list_01._M_array = &local_15c;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_01);
  local_60 = 0x26;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_150);
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_d8,
             local_c0,&stack0xffffffffffffffd0);
  Instruction::Instruction(this_00,c,OpLoopMerge,0,0,(OperandList *)&local_d8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_d8);
  lVar1 = 0x68;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_c0 + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_128);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
            ((IntrusiveNodeBase<spvtools::opt::Instruction> *)this_00,
             (Instruction *)
             ((long)&(((block_ptr->_M_t).
                       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->
                     insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8));
  return;
}

Assistant:

void InlinePass::AddLoopMerge(uint32_t merge_id, uint32_t continue_id,
                              std::unique_ptr<BasicBlock>* block_ptr) {
  std::unique_ptr<Instruction> newLoopMerge(new Instruction(
      context(), spv::Op::OpLoopMerge, 0, 0,
      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {merge_id}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {continue_id}},
       {spv_operand_type_t::SPV_OPERAND_TYPE_LOOP_CONTROL, {0}}}));
  (*block_ptr)->AddInstruction(std::move(newLoopMerge));
}